

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CMStringDecompressDeserialize
          (duckdb *this,Deserializer *deserializer,ScalarFunction *function)

{
  vector<duckdb::LogicalType,_true> *this_00;
  reference input_type;
  LogicalType *other;
  scalar_function_t sStack_48;
  
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&sStack_48,deserializer,100,"arguments");
  this_00 = &(function->super_BaseScalarFunction).super_SimpleFunction.arguments;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&sStack_48);
  input_type = vector<duckdb::LogicalType,_true>::get<true>(this_00,0);
  GetStringDecompressFunctionSwitch(&sStack_48,input_type);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=(&function->function,&sStack_48);
  ::std::_Function_base::~_Function_base(&sStack_48.super__Function_base);
  other = SerializationData::Get<duckdb::LogicalType_const&>(&deserializer->data);
  LogicalType::operator=(&(function->super_BaseScalarFunction).return_type,other);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> CMStringDecompressDeserialize(Deserializer &deserializer, ScalarFunction &function) {
	function.arguments = deserializer.ReadProperty<vector<LogicalType>>(100, "arguments");
	function.function = GetStringDecompressFunctionSwitch(function.arguments[0]);
	function.return_type = deserializer.Get<const LogicalType &>();
	return nullptr;
}